

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferPoolTest.cpp
# Opt level: O1

void __thiscall BufferPool_FreeBuffers_Test::TestBody(BufferPool_FreeBuffers_Test *this)

{
  FreeNode *node;
  FreeNode *pFVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  BufferPool local_48;
  
  memt::BufferPool::BufferPool(&local_48,5);
  lVar2 = 0;
  do {
    memt::BufferPool::freeAllBuffers(&local_48);
    lVar3 = 100;
    do {
      if (local_48._free == (FreeNode *)0x0) {
        if (local_48._blocks._block._position == local_48._blocks._block._end) {
          memt::BufferPool::growCapacity(&local_48);
        }
        pFVar1 = (FreeNode *)local_48._blocks._block._position;
        local_48._blocks._block._position =
             (char *)((long)(FreeNode **)local_48._blocks._block._position + local_48._bufferSize);
      }
      else {
        pFVar1 = local_48._free;
        local_48._free = (local_48._free)->next;
      }
      pFVar1->next = local_48._free;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    memt::BufferPool::freeAllBuffers(&local_48);
    bVar4 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar4);
  memt::MemoryBlocks::freeAllBlocks(&local_48._blocks);
  return;
}

Assistant:

TEST(BufferPool, FreeBuffers) {
  memt::BufferPool pool(5);
  for (size_t j = 0; j < 2; ++j) {
    pool.freeAllBuffers();
    for (size_t i = 0; i < 100; ++i) {
      pool.free(pool.alloc());
      pool.alloc();
    }
    pool.freeAllBuffers();
  }
}